

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

SquareMatrix<3> * __thiscall
pbrt::SquareMatrix<3>::operator/
          (SquareMatrix<3> *__return_storage_ptr__,SquareMatrix<3> *this,Float s)

{
  undefined1 (*pauVar1) [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  __return_storage_ptr__->m[2][2] = this->m[2][2];
  uVar2 = *(undefined8 *)(this->m[0] + 2);
  uVar3 = *(undefined8 *)(this->m[1] + 1);
  uVar4 = *(undefined8 *)this->m[2];
  *(undefined8 *)__return_storage_ptr__->m[0] = *(undefined8 *)this->m[0];
  *(undefined8 *)(__return_storage_ptr__->m[0] + 2) = uVar2;
  *(undefined8 *)(__return_storage_ptr__->m[1] + 1) = uVar3;
  *(undefined8 *)__return_storage_ptr__->m[2] = uVar4;
  auVar8._4_4_ = s;
  auVar8._0_4_ = s;
  auVar8._8_4_ = s;
  auVar8._12_4_ = s;
  lVar5 = 0;
  do {
    auVar6._0_12_ = SUB1612(*(undefined1 (*) [16])((long)__return_storage_ptr__->m[0] + lVar5),0);
    auVar6._12_4_ = 0;
    auVar6 = vdivps_avx(auVar6,auVar8);
    pauVar1 = (undefined1 (*) [16])((long)__return_storage_ptr__->m[0] + lVar5);
    auVar7._0_12_ = auVar6._0_12_;
    auVar7._12_4_ = *(undefined4 *)(*pauVar1 + 0xc);
    *pauVar1 = auVar7;
    lVar5 = lVar5 + 0xc;
  } while (lVar5 != 0x24);
  return __return_storage_ptr__;
}

Assistant:

operator/(Float s) const {
        DCHECK_NE(s, 0);
        SquareMatrix r = *this;
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                r.m[i][j] /= s;
        return r;
    }